

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::enum_to_stem_string::groupingStrategy
               (UGroupingStrategy value,UnicodeString *sb)

{
  ConstChar16Ptr local_50;
  ConstChar16Ptr local_48;
  ConstChar16Ptr local_40;
  ConstChar16Ptr local_38 [3];
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *sb_local;
  UGroupingStrategy value_local;
  
  local_18 = sb;
  sb_local._4_4_ = value;
  switch(value) {
  case UNUM_GROUPING_OFF:
    ConstChar16Ptr::ConstChar16Ptr(&local_20,L"group-off");
    UnicodeString::append(sb,&local_20,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_20);
    break;
  case UNUM_GROUPING_MIN2:
    ConstChar16Ptr::ConstChar16Ptr(local_38,L"group-min2");
    UnicodeString::append(sb,local_38,-1);
    ConstChar16Ptr::~ConstChar16Ptr(local_38);
    break;
  case UNUM_GROUPING_AUTO:
    ConstChar16Ptr::ConstChar16Ptr(&local_40,L"group-auto");
    UnicodeString::append(sb,&local_40,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_40);
    break;
  case UNUM_GROUPING_ON_ALIGNED:
    ConstChar16Ptr::ConstChar16Ptr(&local_48,L"group-on-aligned");
    UnicodeString::append(sb,&local_48,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    break;
  case UNUM_GROUPING_THOUSANDS:
    ConstChar16Ptr::ConstChar16Ptr(&local_50,L"group-thousands");
    UnicodeString::append(sb,&local_50,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_50);
  }
  return;
}

Assistant:

void enum_to_stem_string::groupingStrategy(UGroupingStrategy value, UnicodeString& sb) {
    switch (value) {
        case UNUM_GROUPING_OFF:
            sb.append(u"group-off", -1);
            break;
        case UNUM_GROUPING_MIN2:
            sb.append(u"group-min2", -1);
            break;
        case UNUM_GROUPING_AUTO:
            sb.append(u"group-auto", -1);
            break;
        case UNUM_GROUPING_ON_ALIGNED:
            sb.append(u"group-on-aligned", -1);
            break;
        case UNUM_GROUPING_THOUSANDS:
            sb.append(u"group-thousands", -1);
            break;
        default:
            U_ASSERT(false);
    }
}